

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Value * __thiscall
soul::Value::tryCastToType(Value *__return_storage_ptr__,Value *this,Type *destType)

{
  bool bVar1;
  byte local_b1;
  PackedData local_98;
  PackedData local_80;
  Type local_68;
  undefined1 local_4d;
  byte local_39;
  Type local_38;
  Type *local_20;
  Type *destType_local;
  Value *this_local;
  Value *v;
  
  local_20 = destType;
  destType_local = &this->type;
  this_local = __return_storage_ptr__;
  bVar1 = Type::isIdentical(destType,&this->type);
  if (bVar1) {
    Value(__return_storage_ptr__,this);
  }
  else {
    bVar1 = TypeRules::canCastTo(local_20,&this->type);
    if (bVar1) {
      bVar1 = Type::isUnsizedArray(local_20);
      local_39 = 0;
      local_b1 = 0;
      if (bVar1) {
        Type::removeConstIfPresent(&local_38,local_20);
        local_39 = 1;
        bVar1 = Type::isIdentical(&local_38,&this->type);
        local_b1 = bVar1 ^ 0xff;
      }
      if ((local_39 & 1) != 0) {
        Type::~Type(&local_38);
      }
      if ((local_b1 & 1) == 0) {
        local_4d = 0;
        Type::Type(&local_68,local_20);
        Value(__return_storage_ptr__,&local_68);
        Type::~Type(&local_68);
        getData(&local_80,__return_storage_ptr__);
        getData(&local_98,this);
        PackedData::setFrom(&local_80,&local_98);
      }
      else {
        Value(__return_storage_ptr__);
      }
    }
    else {
      Value(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::tryCastToType (const Type& destType) const
{
    if (destType.isIdentical (type))
        return *this;

    if (! TypeRules::canCastTo (destType, type))
        return {};

    if (destType.isUnsizedArray()
          && ! destType.removeConstIfPresent().isIdentical (type))
        return {};

    Value v (destType);
    v.getData().setFrom (getData());
    return v;
}